

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::CropParameter::ByteSizeLong(CropParameter *this)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  sVar3 = google::protobuf::internal::WireFormatLite::UInt32Size(&this->offset_);
  sVar4 = sVar3 + sVar4 + (ulong)(uint)(this->offset_).current_size_;
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if (this->axis_ < 0) {
      uVar6 = 0xb;
    }
    else {
      uVar5 = this->axis_ | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar6;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t CropParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.CropParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated uint32 offset = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt32Size(this->offset_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->offset_size());
    total_size += data_size;
  }

  // optional int32 axis = 1 [default = 2];
  if (has_axis()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->axis());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}